

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O1

_Bool trans_PTEST(DisasContext_conflict1 *s,arg_PTEST *a)

{
  TCGContext_conflict1 *s_00;
  _Bool _Var1;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  TCGTemp *ts;
  TCGTemp *ts_00;
  int iVar2;
  int iVar3;
  int gofs;
  int dofs;
  
  s_00 = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (!_Var1) {
    return _Var1;
  }
  dofs = a->rn * 0x20 + 0x2c10;
  gofs = a->pg * 0x20 + 0x2c10;
  iVar2 = s->sve_len >> 3;
  if (iVar2 - 1U < 8) {
    ts = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    ts_00 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i64,(TCGArg)ts,(TCGArg)(s_00->cpu_env + (long)s_00),
                        (long)dofs);
    tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i64,(TCGArg)ts_00,(TCGArg)(s_00->cpu_env + (long)s_00),
                        (long)gofs);
    do_predtest1(s_00,(TCGv_i64)((long)ts - (long)s_00),(TCGv_i64)((long)ts_00 - (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,ts);
    tcg_temp_free_internal_aarch64(s_00,ts_00);
    return (_Bool)extraout_AL;
  }
  iVar3 = iVar2 + 0xe;
  if (-1 < iVar2 + 7) {
    iVar3 = iVar2 + 7;
  }
  do_predtest(s,dofs,gofs,iVar3 >> 3);
  return (_Bool)extraout_AL_00;
}

Assistant:

static bool trans_PTEST(DisasContext *s, arg_PTEST *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (sve_access_check(s)) {
        int nofs = pred_full_reg_offset(s, a->rn);
        int gofs = pred_full_reg_offset(s, a->pg);
        int words = DIV_ROUND_UP(pred_full_reg_size(s), 8);

        if (words == 1) {
            TCGv_i64 pn = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 pg = tcg_temp_new_i64(tcg_ctx);

            tcg_gen_ld_i64(tcg_ctx, pn, tcg_ctx->cpu_env, nofs);
            tcg_gen_ld_i64(tcg_ctx, pg, tcg_ctx->cpu_env, gofs);
            do_predtest1(tcg_ctx, pn, pg);

            tcg_temp_free_i64(tcg_ctx, pn);
            tcg_temp_free_i64(tcg_ctx, pg);
        } else {
            do_predtest(s, nofs, gofs, words);
        }
    }
    return true;
}